

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFAbbreviationDeclaration::getAttributeValue
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFAbbreviationDeclaration *this
          ,uint64_t DIEOffset,Attribute Attr,DWARFUnit *U)

{
  Form FVar1;
  DataExtractor DebugInfoData_00;
  uint64_t uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  const_iterator pAVar7;
  uint *puVar8;
  int64_t V;
  FormParams *pFVar9;
  long *plVar10;
  Optional<long> OVar11;
  anon_union_8_2_fc7899a5_for_OptionalStorage<long,_true>_2 local_100;
  Optional<long> FixedSize;
  undefined1 local_e8 [8];
  DWARFFormValue FormValue;
  AttributeSpec *Spec;
  const_iterator __end1;
  const_iterator __begin1;
  AttributeSpecVector *__range1;
  uint64_t uStack_60;
  uint32_t AttrIndex;
  uint64_t Offset;
  DWARFDataExtractor DebugInfoData;
  Optional<unsigned_int> MatchAttrIndex;
  DWARFUnit *U_local;
  Attribute Attr_local;
  uint64_t DIEOffset_local;
  DWARFAbbreviationDeclaration *this_local;
  
  DebugInfoData.Section = (DWARFSection *)findAttributeIndex(this,Attr);
  bVar6 = llvm::Optional::operator_cast_to_bool((Optional *)&DebugInfoData.Section);
  if (bVar6) {
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)&Offset,U);
    uStack_60 = DIEOffset + this->CodeByteSize;
    __range1._4_4_ = 0;
    __end1 = SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>::
             begin((SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    *)&this->AttributeSpecs);
    pAVar7 = SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>::end
                       ((SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                         *)&this->AttributeSpecs);
    for (; __end1 != pAVar7; __end1 = __end1 + 1) {
      puVar8 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)&DebugInfoData.Section);
      if (*puVar8 == __range1._4_4_) {
        bVar6 = AttributeSpec::isImplicitConst(__end1);
        if (bVar6) {
          FVar1 = __end1->Form;
          V = AttributeSpec::getImplicitConstValue(__end1);
          DWARFFormValue::createFromSValue((DWARFFormValue *)&FormValue.C,FVar1,V);
          Optional<llvm::DWARFFormValue>::Optional
                    (__return_storage_ptr__,(DWARFFormValue *)&FormValue.C);
          return __return_storage_ptr__;
        }
        DWARFFormValue::DWARFFormValue((DWARFFormValue *)local_e8,__end1->Form);
        pFVar9 = DWARFUnit::getFormParams(U);
        FixedSize.Storage._12_4_ = *pFVar9;
        bVar6 = DWARFFormValue::extractValue
                          ((DWARFFormValue *)local_e8,(DWARFDataExtractor *)&Offset,
                           &stack0xffffffffffffffa0,(FormParams)FixedSize.Storage._12_4_,U);
        if (bVar6) {
          Optional<llvm::DWARFFormValue>::Optional
                    (__return_storage_ptr__,(DWARFFormValue *)local_e8);
          return __return_storage_ptr__;
        }
      }
      OVar11 = AttributeSpec::getByteSize(__end1,U);
      local_100 = OVar11.Storage.field_0;
      FixedSize.Storage.field_0.empty = OVar11.Storage.hasVal;
      bVar6 = llvm::Optional::operator_cast_to_bool((Optional *)&local_100.empty);
      sVar4 = DebugInfoData.super_DataExtractor.Data.Length;
      pcVar3 = DebugInfoData.super_DataExtractor.Data.Data;
      uVar2 = Offset;
      if (bVar6) {
        plVar10 = Optional<long>::operator*((Optional<long> *)&local_100);
        uStack_60 = *plVar10 + uStack_60;
      }
      else {
        FVar1 = __end1->Form;
        pFVar9 = DWARFUnit::getFormParams(U);
        sVar5 = DebugInfoData.super_DataExtractor.Data.Length;
        DebugInfoData_00.Data.Length = (size_t)pcVar3;
        DebugInfoData_00.Data.Data = (char *)uVar2;
        DebugInfoData.super_DataExtractor.Data.Length._0_1_ = (undefined1)sVar4;
        DebugInfoData.super_DataExtractor.Data.Length._1_1_ = SUB81(sVar4,1);
        DebugInfoData.super_DataExtractor.Data.Length._2_6_ = SUB86(sVar4,2);
        DebugInfoData_00.IsLittleEndian = (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
        DebugInfoData_00.AddressSize = DebugInfoData.super_DataExtractor.Data.Length._1_1_;
        DebugInfoData_00._18_6_ = DebugInfoData.super_DataExtractor.Data.Length._2_6_;
        DebugInfoData.super_DataExtractor.Data.Length = sVar5;
        DWARFFormValue::skipValue(FVar1,DebugInfoData_00,&stack0xffffffffffffffa0,*pFVar9);
      }
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
  }
  else {
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue> DWARFAbbreviationDeclaration::getAttributeValue(
    const uint64_t DIEOffset, const dwarf::Attribute Attr,
    const DWARFUnit &U) const {
  Optional<uint32_t> MatchAttrIndex = findAttributeIndex(Attr);
  if (!MatchAttrIndex)
    return None;

  auto DebugInfoData = U.getDebugInfoExtractor();

  // Add the byte size of ULEB that for the abbrev Code so we can start
  // skipping the attribute data.
  uint64_t Offset = DIEOffset + CodeByteSize;
  uint32_t AttrIndex = 0;
  for (const auto &Spec : AttributeSpecs) {
    if (*MatchAttrIndex == AttrIndex) {
      // We have arrived at the attribute to extract, extract if from Offset.
      if (Spec.isImplicitConst())
        return DWARFFormValue::createFromSValue(Spec.Form,
                                                Spec.getImplicitConstValue());

      DWARFFormValue FormValue(Spec.Form);
      if (FormValue.extractValue(DebugInfoData, &Offset, U.getFormParams(), &U))
        return FormValue;
    }
    // March Offset along until we get to the attribute we want.
    if (auto FixedSize = Spec.getByteSize(U))
      Offset += *FixedSize;
    else
      DWARFFormValue::skipValue(Spec.Form, DebugInfoData, &Offset,
                                U.getFormParams());
    ++AttrIndex;
  }
  return None;
}